

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

Interval * deqp::egl::approximateInt(Interval *__return_storage_ptr__,int i)

{
  float fVar1;
  Interval local_d0;
  Interval local_b8;
  Interval local_a0;
  Interval local_88;
  Interval local_70;
  Interval local_58;
  Interval local_40;
  undefined1 local_28 [8];
  Interval margin;
  int i_local;
  
  margin.m_hi._4_4_ = i;
  tcu::Interval::Interval(&local_40,-1.0);
  tcu::Interval::Interval(&local_58,1.0);
  tcu::Interval::Interval((Interval *)local_28,&local_40,&local_58);
  tcu::Interval::Interval(&local_88,(double)margin.m_hi._4_4_);
  tcu::operator+(&local_70,&local_88,(Interval *)local_28);
  tcu::Interval::Interval(&local_b8,0.0);
  fVar1 = std::numeric_limits<float>::infinity();
  tcu::Interval::Interval(&local_d0,(double)fVar1);
  tcu::Interval::Interval(&local_a0,&local_b8,&local_d0);
  tcu::Interval::operator&(__return_storage_ptr__,&local_70,&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Interval approximateInt (int i)
{
	const Interval margin(-1.0, 1.0); // The resolution may be rounded

	return (Interval(i) + margin) & Interval(0.0, TCU_INFINITY);
}